

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_insertproxymodel.cpp
# Opt level: O3

bool __thiscall
tst_InsertProxyModel::testCommitSubclass::InsertProxyModelCommit::validColumn
          (InsertProxyModelCommit *this)

{
  undefined4 uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  long *plVar6;
  bool bVar7;
  anon_union_24_3_e3d07ef4_for_data local_88;
  ulong local_70;
  ulong local_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined1 local_48 [16];
  long *local_38;
  
  lVar5 = QAbstractProxyModel::sourceModel();
  if (lVar5 == 0) {
    iVar3 = 0;
  }
  else {
    plVar6 = (long *)QAbstractProxyModel::sourceModel();
    local_88._forAlignment = -NAN;
    local_88._8_8_ = 0;
    local_88._16_8_ = 0;
    uVar1 = (**(code **)(*plVar6 + 0x80))(plVar6,&local_88);
    plVar6 = (long *)QAbstractProxyModel::sourceModel();
    local_88._forAlignment = -NAN;
    local_88._8_8_ = 0;
    local_88._16_8_ = 0;
    iVar2 = (**(code **)(*plVar6 + 0x78))(plVar6,&local_88);
    iVar4 = 0;
    iVar3 = iVar4;
    if (0 < iVar2) {
      do {
        local_60 = 0xffffffffffffffff;
        local_58 = 0;
        uStack_50 = 0;
        (**(code **)(*(long *)this + 0x60))(local_48,this,iVar4,uVar1,&local_60);
        if (local_38 == (long *)0x0) {
          local_88.shared = (PrivateShared *)0x0;
          local_88._8_8_ = 0;
          local_88._16_8_ = 0;
          local_70 = 2;
          local_68 = 0;
        }
        else {
          (**(code **)(*local_38 + 0x90))(&local_88,local_38,local_48,0);
          local_68 = local_70 & 0xfffffffffffffffc;
        }
        iVar3 = QMetaType::isValid();
        QVariant::~QVariant((QVariant *)&local_88);
        bVar7 = iVar2 + -1 != iVar4;
        iVar4 = iVar4 + 1;
      } while (bVar7 && (char)iVar3 == '\0');
    }
  }
  return SUB41(iVar3,0);
}

Assistant:

bool validColumn() const Q_DECL_OVERRIDE
        {
            if (!sourceModel())
                return false;
            const int sourceCols = sourceModel()->columnCount();
            const int sourceRows = sourceModel()->rowCount();
            for (int i = 0; i < sourceRows; ++i) {
                if (index(i, sourceCols).data().isValid())
                    return true;
            }
            return false;
        }